

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O1

void __thiscall Sandbox::renderPrep(Sandbox *this)

{
  mutex *__mutex;
  string *_file;
  UniformFunctionsMap *this_00;
  bool bVar1;
  int iVar2;
  uint32_t _width;
  uint32_t _height;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  mapped_type *pmVar5;
  socklen_t in_ECX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *extraout_RDX_02;
  sockaddr *extraout_RDX_03;
  sockaddr *extraout_RDX_04;
  sockaddr *extraout_RDX_05;
  sockaddr *extraout_RDX_06;
  sockaddr *__addr;
  key_type *__k;
  ulong uVar6;
  Uniforms *pUVar7;
  Uniforms *this_01;
  string *_ext;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  long lVar9;
  string local_50;
  
  if ((this->uniforms).tracker.m_running == true) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"render","");
    Tracker::begin(&(this->uniforms).tracker,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  this_01 = &this->uniforms;
  if ((this->m_initialized == true) &&
     (Uniforms::update(this_01),
     (this->uniforms).loadQueue._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    __mutex = &(this->uniforms).loadMutex;
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    for (p_Var4 = (this->uniforms).loadQueue._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(this->uniforms).loadQueue._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      in_ECX = 1;
      vera::Scene::addTexture
                (&this_01->super_Scene,(string *)(p_Var4 + 1),(Image *)(p_Var4 + 2),true,true);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Image>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Image>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Image>_>_>
    ::clear(&(this->uniforms).loadQueue._M_t);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  paVar8 = &local_50.field_2;
  if (((this->m_update_buffers != false) ||
      (this->m_buffers_total !=
       (int)((ulong)((long)(this->uniforms).buffers.
                           super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->uniforms).buffers.
                          super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3))) ||
     (this->m_doubleBuffers_total !=
      (int)((ulong)((long)(this->uniforms).doubleBuffers.
                          super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->uniforms).doubleBuffers.
                         super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 3))) {
    _updateBuffers(this);
  }
  if ((((this->uniforms).buffers.super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (this->uniforms).buffers.super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
        _M_impl.super__Vector_impl_data._M_start) ||
      ((this->uniforms).doubleBuffers.
       super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>._M_impl.
       super__Vector_impl_data._M_finish !=
       (this->uniforms).doubleBuffers.
       super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>._M_impl.
       super__Vector_impl_data._M_start)) ||
     ((0 < this->m_pyramid_total || (0 < this->m_flood_total)))) {
    _renderBuffers(this);
  }
  if ((this->uniforms).super_Scene.models._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    SceneRender::renderShadowMap(&this->m_sceneRender,this_01);
  }
  _file = &this->screenshotFile;
  iVar2 = std::__cxx11::string::compare((char *)_file);
  if (((iVar2 != 0) || (bVar1 = isRecording(), bVar1)) &&
     ((this->m_record_fbo).m_allocated == false)) {
    _width = vera::getWindowWidth();
    _height = vera::getWindowHeight();
    in_ECX = 1;
    vera::Fbo::allocate(&this->m_record_fbo,_width,_height,COLOR_TEXTURE_DEPTH_BUFFER,LINEAR,REPEAT,
                        true);
  }
  local_50._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"u_sceneNormal","");
  this_00 = &(this->uniforms).functions;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
           ::operator[](this_00,&local_50);
  bVar1 = pmVar5->present;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar8) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (bVar1 != false) {
    SceneRender::renderNormalBuffer(&this->m_sceneRender,this_01);
  }
  local_50._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"u_scenePosition","");
  __k = &local_50;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
           ::operator[](this_00,__k);
  iVar2 = (int)__k;
  bVar1 = pmVar5->present;
  __addr = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar8) {
    uVar6 = local_50.field_2._M_allocated_capacity + 1;
    operator_delete(local_50._M_dataplus._M_p,uVar6);
    iVar2 = (int)uVar6;
    __addr = extraout_RDX_00;
  }
  if (bVar1 != false) {
    pUVar7 = this_01;
    SceneRender::renderPositionBuffer(&this->m_sceneRender,this_01);
    iVar2 = (int)pUVar7;
    __addr = extraout_RDX_01;
  }
  if ((this->m_sceneRender).m_buffers_total != 0) {
    SceneRender::renderBuffers(&this->m_sceneRender,this_01);
    iVar2 = (int)this_01;
    __addr = extraout_RDX_02;
  }
  lVar9 = 0x8a0;
  if ((this->m_postprocessing == false) && (4 < this->m_plot - PLOT_LUMA)) {
    iVar2 = 0x3194fe;
    iVar3 = std::__cxx11::string::compare((char *)_file);
    if (iVar3 == 0) {
      lVar9 = 0x2660;
      bVar1 = isRecording();
      __addr = extraout_RDX_06;
      if (!bVar1) goto LAB_001bae5e;
    }
    else {
      local_50._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"png","");
      _ext = &local_50;
      bVar1 = vera::haveExt(_file,_ext);
      iVar2 = (int)_ext;
      __addr = extraout_RDX_03;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar8) {
        uVar6 = local_50.field_2._M_allocated_capacity + 1;
        operator_delete(local_50._M_dataplus._M_p,uVar6);
        iVar2 = (int)uVar6;
        __addr = extraout_RDX_04;
      }
      lVar9 = 0x2660;
      if (bVar1) {
        glEnable(0xbe2);
        iVar2 = 0x303;
        glBlendFunc(1);
        __addr = extraout_RDX_05;
      }
    }
  }
  vera::Fbo::bind((Fbo *)((long)&this->_vptr_Sandbox + lVar9),iVar2,__addr,in_ECX);
LAB_001bae5e:
  glClear(0x4100);
  return;
}

Assistant:

void Sandbox::renderPrep() {
    TRACK_BEGIN("render")

    // UPDATE STREAMING TEXTURES
    // -----------------------------------------------
    if (m_initialized) {
        uniforms.update();
        if (uniforms.loadQueue.size() > 0) {
            uniforms.loadMutex.lock();
            for (ImagesMap::iterator it = uniforms.loadQueue.begin(); it != uniforms.loadQueue.end(); ++it)
                uniforms.addTexture( it->first, it->second );
            uniforms.loadQueue.clear();
            uniforms.loadMutex.unlock();
        }
    }

    // BUFFERS
    // -----------------------------------------------
    if (m_update_buffers ||
        m_buffers_total != int(uniforms.buffers.size()) ||
        m_doubleBuffers_total != int(uniforms.doubleBuffers.size()) )
        _updateBuffers();
    
    if (uniforms.buffers.size() > 0 || 
        uniforms.doubleBuffers.size() > 0 ||
        m_pyramid_total > 0 ||
        m_flood_total > 0)
        _renderBuffers();

    // RENDER SHADOW MAP
    // -----------------------------------------------
    if (uniforms.models.size() > 0)
        m_sceneRender.renderShadowMap(uniforms);
    
    // MAIN SCENE
    // ----------------------------------------------- < main scene start
    if (screenshotFile != "" || isRecording() )
        if (!m_record_fbo.isAllocated())
            m_record_fbo.allocate(vera::getWindowWidth(), vera::getWindowHeight(), vera::COLOR_TEXTURE_DEPTH_BUFFER);

    if (uniforms.functions["u_sceneNormal"].present)
        m_sceneRender.renderNormalBuffer(uniforms);

    if (uniforms.functions["u_scenePosition"].present)
        m_sceneRender.renderPositionBuffer(uniforms);

    if (m_sceneRender.getBuffersTotal() != 0)
        m_sceneRender.renderBuffers(uniforms);

    if (m_postprocessing || m_plot == PLOT_LUMA || m_plot == PLOT_RGB || m_plot == PLOT_RED || m_plot == PLOT_GREEN || m_plot == PLOT_BLUE ) {
        m_sceneRender.renderFbo.bind();
    }
    else if (screenshotFile != "") {
        if (vera::haveExt(screenshotFile, "png")) {
            glEnable(GL_BLEND);
            glBlendFunc(GL_ONE, GL_ONE_MINUS_SRC_ALPHA);
        }
        m_record_fbo.bind();
    }
    else if (isRecording())
        m_record_fbo.bind();

    // Clear the background
    glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
}